

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O0

void __thiscall MlNeuron::prepareNextState(MlNeuron *this)

{
  bool bVar1;
  double dVar2;
  MlNeuron *this_local;
  
  DifferentialEquation::prepareNextState(&this->mlneuronMembrane);
  bVar1 = StochasticProcess::isNextStatePrepared((StochasticProcess *)&this->mlneuronMembrane);
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextStateIsPrepared = bVar1;
  dVar2 = StochasticProcess::getNextValue((StochasticProcess *)&this->mlneuronMembrane);
  (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
  super_StochasticProcess.stochNextValue = dVar2;
  if (((this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
       super_StochasticProcess.stochNextStateIsPrepared & 1U) != 0) {
    dVar2 = (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
            super_StochasticProcess.stochNextValue;
    if (dVar2 < this->mlneuronTheta || dVar2 == this->mlneuronTheta) {
      (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = false;
    }
    else {
      (this->super_SpikingNeuron).super_StochasticEventGenerator.eventNextValue = true;
    }
  }
  return;
}

Assistant:

void MlNeuron::prepareNextState()
{
	// create next value of differential equation
	mlneuronMembrane.prepareNextState();
	stochNextStateIsPrepared = mlneuronMembrane.isNextStatePrepared();
	stochNextValue = mlneuronMembrane.getNextValue();
	
	// proceed if calculation was successful
	if (stochNextStateIsPrepared) {
		if (stochNextValue > mlneuronTheta)
			eventNextValue = true;
		else 
			eventNextValue = false;
	}
}